

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  void *zData;
  long lVar5;
  byte *pbVar6;
  int nData;
  ulong uVar7;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_30;
  
  if (*pRC == 0) {
    zData = sqlite3_malloc(p->nColumn * 10);
    if (zData == (void *)0x0) {
      iVar4 = 7;
    }
    else {
      iVar4 = p->nColumn;
      if ((long)iVar4 < 1) {
        nData = 0;
      }
      else {
        lVar5 = 0;
        nData = 0;
        do {
          pbVar3 = (byte *)((long)nData + (long)zData);
          uVar7 = (ulong)aSz[lVar5];
          do {
            pbVar6 = pbVar3;
            bVar2 = (byte)uVar7;
            *pbVar6 = bVar2 | 0x80;
            nData = nData + 1;
            bVar1 = 0x7f < uVar7;
            pbVar3 = pbVar6 + 1;
            uVar7 = uVar7 >> 7;
          } while (bVar1);
          *pbVar6 = bVar2;
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      iVar4 = fts3SqlStmt(p,0x14,&local_30,(sqlite3_value **)0x0);
      if (iVar4 == 0) {
        sqlite3_bind_int64(local_30,1,p->iPrevDocid);
        bindText(local_30,2,zData,nData,sqlite3_free,'\0');
        sqlite3_step(local_30);
        iVar4 = sqlite3_reset(local_30);
      }
      else {
        sqlite3_free(zData);
      }
    }
    *pRC = iVar4;
    return;
  }
  return;
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc( 10*p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}